

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liveglsl_tests.cpp
# Opt level: O0

void utest_register_gui_component_parse_invalid(void)

{
  size_t sVar1;
  size_t sVar2;
  char *__s;
  char *name;
  size_t name_size;
  char *name_part;
  size_t index;
  
  sVar1 = utest_state.tests_length;
  utest_state.tests_length = utest_state.tests_length + 1;
  sVar2 = strlen("gui.component_parse_invalid");
  __s = (char *)malloc(sVar2 + 1);
  utest_state.tests =
       (utest_test_state_s *)realloc(utest_state.tests,utest_state.tests_length * 0x18);
  utest_state.tests[sVar1].func = utest_gui_component_parse_invalid;
  utest_state.tests[sVar1].name = __s;
  snprintf(__s,sVar2 + 1,"%s","gui.component_parse_invalid");
  return;
}

Assistant:

UTEST(gui, component_parse_invalid) {
    std::string line, uniform_line, error;
    GUIComponent component;

    line = "invalid_gui(-1, 2.5)";
    uniform_line = "uniform float v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid GUI type name 'invalid_gui' at line 0");

    line = "invalid_gui()";
    uniform_line = "uniform float v0;";
    T(!GUIComponentParse(0, line, uniform_line, {}, component, error));
    TSTR(error.c_str(), "Invalid GUI type name 'invalid_gui' at line 0");
}